

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::makeStructCmpxchg<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,WATParser *this,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  MemoryOrder MVar1;
  Index field_00;
  MemoryOrder *pMVar2;
  Err *pEVar3;
  HeapTypeT *pHVar4;
  HeapType type_00;
  uint *puVar5;
  undefined4 in_register_0000000c;
  bool bVar6;
  HeapTypeT type_01;
  Err local_278;
  Err *local_258;
  Err *err_3;
  Result<unsigned_int> _val_3;
  undefined1 local_218 [8];
  Result<unsigned_int> field;
  Err *err_2;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> _val_2;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type;
  string local_170;
  Err local_150;
  Err local_130;
  Err *local_110;
  Err *err_1;
  Result<wasm::MemoryOrder> _val_1;
  Result<wasm::MemoryOrder> order2;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::MemoryOrder> _val;
  Result<wasm::MemoryOrder> order1;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
               super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20);
  memorder<wasm::WATParser::ParseDefsCtx>
            ((Result<wasm::MemoryOrder> *)__return_storage_ptr___00,(ParseDefsCtx *)this);
  Result<wasm::MemoryOrder>::Result
            ((Result<wasm::MemoryOrder> *)local_78,
             (Result<wasm::MemoryOrder> *)__return_storage_ptr___00);
  local_90 = Result<wasm::MemoryOrder>::getErr((Result<wasm::MemoryOrder> *)local_78);
  bVar6 = local_90 == (Err *)0x0;
  if (!bVar6) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  Result<wasm::MemoryOrder>::~Result((Result<wasm::MemoryOrder> *)local_78);
  if (bVar6) {
    memorder<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::MemoryOrder> *)
               ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
               (ParseDefsCtx *)this);
    Result<wasm::MemoryOrder>::Result
              ((Result<wasm::MemoryOrder> *)&err_1,
               (Result<wasm::MemoryOrder> *)
               ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
    local_110 = Result<wasm::MemoryOrder>::getErr((Result<wasm::MemoryOrder> *)&err_1);
    bVar6 = local_110 == (Err *)0x0;
    if (!bVar6) {
      wasm::Err::Err(&local_130,local_110);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_130);
      wasm::Err::~Err(&local_130);
    }
    Result<wasm::MemoryOrder>::~Result((Result<wasm::MemoryOrder> *)&err_1);
    if (bVar6) {
      pMVar2 = Result<wasm::MemoryOrder>::operator*
                         ((Result<wasm::MemoryOrder> *)
                          ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      MVar1 = *pMVar2;
      pMVar2 = Result<wasm::MemoryOrder>::operator*
                         ((Result<wasm::MemoryOrder> *)
                          ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      if (MVar1 == *pMVar2) {
        typeidx<wasm::WATParser::ParseDefsCtx>
                  ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                    *)((long)&_val_2.val.
                              super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                      + 0x20),(ParseDefsCtx *)this);
        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::Result
                  ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                    *)&err_2,
                   (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                    *)((long)&_val_2.val.
                              super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                      + 0x20));
        pEVar3 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
                 getErr((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                         *)&err_2);
        if (pEVar3 != (Err *)0x0) {
          wasm::Err::Err((Err *)((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                        super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                        super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
                         pEVar3);
          Result<wasm::Ok>::Result
                    (__return_storage_ptr__,
                     (Err *)((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                    super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                    super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                    super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
          wasm::Err::~Err((Err *)((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        }
        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::~Result
                  ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                    *)&err_2);
        if (pEVar3 == (Err *)0x0) {
          pHVar4 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                   ::operator*((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                                *)((long)&_val_2.val.
                                          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                  + 0x20));
          _val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = (pHVar4->type).id;
          type_01.type.id = *(ulong *)&pHVar4->exactness & 0xffffffff;
          type_01._8_8_ = annotations;
          fieldidx<wasm::WATParser::ParseDefsCtx>
                    ((Result<unsigned_int> *)local_218,this,
                     (ParseDefsCtx *)
                     _val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_,type_01);
          Result<unsigned_int>::Result
                    ((Result<unsigned_int> *)&err_3,(Result<unsigned_int> *)local_218);
          local_258 = Result<unsigned_int>::getErr((Result<unsigned_int> *)&err_3);
          bVar6 = local_258 == (Err *)0x0;
          if (!bVar6) {
            wasm::Err::Err(&local_278,local_258);
            Result<wasm::Ok>::Result(__return_storage_ptr__,&local_278);
            wasm::Err::~Err(&local_278);
          }
          Result<unsigned_int>::~Result((Result<unsigned_int> *)&err_3);
          if (bVar6) {
            pHVar4 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                     ::operator*((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                                  *)((long)&_val_2.val.
                                            super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                            .
                                            super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                            .
                                            super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                    + 0x20));
            type_00 = TypeParserCtx::HeapTypeT::operator_cast_to_HeapType((HeapTypeT *)pHVar4);
            puVar5 = Result<unsigned_int>::operator*((Result<unsigned_int> *)local_218);
            field_00 = *puVar5;
            pMVar2 = Result<wasm::MemoryOrder>::operator*
                               ((Result<wasm::MemoryOrder> *)
                                ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                        super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20)
                               );
            ParseDefsCtx::makeStructCmpxchg
                      (__return_storage_ptr__,(ParseDefsCtx *)this,(Index)ctx,
                       (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                        *)CONCAT44(in_register_0000000c,pos),type_00,field_00,*pMVar2);
          }
          Result<unsigned_int>::~Result((Result<unsigned_int> *)local_218);
        }
        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::~Result
                  ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                    *)((long)&_val_2.val.
                              super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                      + 0x20));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"struct.atomic.rmw memory orders must be identical",
                   (allocator<char> *)
                   ((long)&type.val.
                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   + 0x27));
        Lexer::err(&local_150,(Lexer *)(this + 8),(ulong)ctx & 0xffffffff,&local_170);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_150);
        wasm::Err::~Err(&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&type.val.
                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   + 0x27));
      }
    }
    Result<wasm::MemoryOrder>::~Result
              ((Result<wasm::MemoryOrder> *)
               ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
  }
  Result<wasm::MemoryOrder>::~Result
            ((Result<wasm::MemoryOrder> *)
             ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStructCmpxchg(Ctx& ctx,
                           Index pos,
                           const std::vector<Annotation>& annotations) {
  auto order1 = memorder(ctx);
  CHECK_ERR(order1);
  auto order2 = memorder(ctx);
  CHECK_ERR(order2);
  if (*order1 != *order2) {
    return ctx.in.err(pos, "struct.atomic.rmw memory orders must be identical");
  }
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto field = fieldidx(ctx, *type);
  CHECK_ERR(field);
  return ctx.makeStructCmpxchg(pos, annotations, *type, *field, *order1);
}